

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cc
# Opt level: O2

void __thiscall brown::Simulator::renderLoop(Simulator *this,Tile *dd)

{
  uintptr_t uVar1;
  long lVar2;
  App *this_00;
  uint32_t uVar3;
  uint32_t *puVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  size_t sVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  float fVar21;
  int mousx;
  App *local_50;
  float local_44;
  int dmousy;
  int dmousx;
  int bstatus;
  int mousy;
  
  local_50 = this->app;
  uVar12 = this->BMPYRES;
  if (dd->y < this->BMPYRES) {
    uVar12 = dd->y;
  }
  uVar16 = (ulong)uVar12;
  while (0 < (int)uVar16) {
    uVar16 = (long)(int)uVar16 - 1;
    iVar19 = dd->p;
    uVar1 = dd->f;
    uVar12 = this->BMPXRES;
    if (dd->x < this->BMPXRES) {
      uVar12 = dd->x;
    }
    while (0 < (int)uVar12) {
      uVar12 = uVar12 - 1;
      puVar4 = Tile::getpix(&this->drawing,uVar12,(int)uVar16);
      *(uint32_t *)((long)iVar19 * uVar16 + uVar1 + (ulong)uVar12 * 4) = *puVar4;
    }
  }
  Tile::drawrectfill(dd,this->BMPXRES,0,dd->x,this->BMPYRES,0);
  Tile::drawrectfill(dd,0,this->BMPYRES,dd->x,dd->y,0);
  uVar3 = 0xff0000;
  if (this->odown != false) {
    uVar3 = 0xff00;
  }
  Tile::drawcirc(dd,(this->BMPXRES >> 1) + (this->acur[0] >> 6),
                 (this->BMPYRES >> 1) + (this->acur[1] >> 6),0x14,uVar3);
  sVar10 = this->fifn;
  Tile::print6x8(dd,0,0,0xffffff,0,"%.2f sec, fifn=%d",(double)this->pclk / (double)this->CLKFRQ,
                 sVar10);
  this_00 = local_50;
  pcVar5 = App::getKeyStatus(local_50);
  App::getMouseStatus(this_00,&mousx,&mousy,&dmousx,&dmousy,&bstatus);
  renderLoop::otim = renderLoop::tim;
  uVar3 = App::getTime(this_00);
  renderLoop::tim = (double)uVar3 * 0.001;
  lVar2 = this->zoom;
  lVar9 = (long)((double)this->xoff +
                (double)(((long)pcVar5[0xcd] - (long)pcVar5[0xcb]) * lVar2 * 0x200) *
                (renderLoop::tim - renderLoop::otim));
  this->xoff = lVar9;
  lVar7 = lVar2;
  if (((byte)bstatus & 2) != 0) {
    lVar6 = (dmousy * lVar2) / 100 + lVar2;
    lVar7 = 100;
    if (100 < lVar6) {
      lVar7 = lVar6;
    }
    renderLoop::i = 10000000;
    if (lVar6 < 10000000) {
      renderLoop::i = (int)lVar7;
    }
    lVar7 = (long)renderLoop::i;
    lVar9 = (long)mousx * (lVar2 - lVar7) + dmousx * lVar2 + lVar9;
    this->xoff = lVar9;
    this->zoom = lVar7;
  }
  uVar12 = this->fault;
  if (uVar12 != 0) {
    iVar19 = (int)((this->faultclk - lVar9) / lVar7);
    if ((uVar12 & 0xfffffffe) == 2) {
      sVar10 = CONCAT44((int)(sVar10 >> 0x20),uVar12) & 0xffffffff00000001 | 0x78;
      Tile::print6x8(dd,iVar19,0x25d,0xff8080,0,"fault: %c div by 0",sVar10);
      uVar12 = this->fault;
    }
    if ((uVar12 & 0xfffffffe) == 4) {
      sVar10 = CONCAT44((int)(sVar10 >> 0x20),uVar12) & 0xffffffff00000001 | 0x78;
      Tile::print6x8(dd,iVar19,0x25d,0xff8080,0,"fault: %c dir change at hi veloc",sVar10);
      uVar12 = this->fault;
    }
    if ((uVar12 & 0xfffffffe) == 6) {
      sVar10 = CONCAT44((int)(sVar10 >> 0x20),uVar12) & 0xffffffff00000001 | 0x78;
      Tile::print6x8(dd,iVar19,0x25d,0xff8080,0,"fault: %c veloc too high",sVar10);
      uVar12 = this->fault;
    }
    if ((uVar12 & 0xfffffffe) == 8) {
      sVar10 = CONCAT44((int)(sVar10 >> 0x20),uVar12) | 0x78;
      Tile::print6x8(dd,iVar19,0x25d,0xff8080,0,"fault: %c accel too high",sVar10);
    }
    Tile::drawline(dd,(float)iVar19,615.0,(float)iVar19,815.0,0xff8080);
    lVar9 = this->xoff;
    lVar7 = this->zoom;
  }
  lVar2 = this->fifclk[this->fifn - 1];
  for (renderLoop::i = 0; renderLoop::i < 5; renderLoop::i = renderLoop::i + 1) {
    Tile::drawrectfill(dd,-(int)(lVar9 / lVar7),renderLoop::i * 0x28 + 0x267,
                       (int)((lVar2 - lVar9) / lVar7),renderLoop::i * 0x28 + 0x285,0x404040);
  }
  renderLoop::dpx = -1;
  renderLoop::dpy = -1;
  renderLoop::i = 0;
  renderLoop::rzoom =
       SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x40000000)) / SEXT816(this->zoom),0) << 2;
  uVar16 = 0;
  while( true ) {
    uVar8 = (ulong)renderLoop::i;
    uVar18 = this->fifn;
    if (uVar18 <= uVar8) break;
    uVar18 = (this->fifclk[uVar8] - this->xoff) * renderLoop::rzoom;
    iVar19 = (int)uVar16;
    if (-1 < (long)uVar18) {
      uVar16 = uVar18 >> 0x20;
      iVar17 = (int)(uVar18 >> 0x20);
      if ((renderLoop::dpx < iVar17) && ((this->fifbit[uVar8] & 1U) != 0)) {
        renderLoop::dpx = iVar17;
        Tile::drawline(dd,(float)iVar17,615.0,(float)iVar17,645.0,0xffffff);
      }
      if ((renderLoop::dpy < iVar17) && ((this->fifbit[renderLoop::i] & 2U) != 0)) {
        renderLoop::dpy = iVar17;
        Tile::drawline(dd,(float)iVar17,695.0,(float)iVar17,725.0,0xffffff);
      }
      if (0 < renderLoop::i) {
        local_44 = (float)iVar19;
        fVar21 = (float)(int)(((byte)this->fifbit[(ulong)(uint)renderLoop::i - 1] >> 2 & 1) * -0x1e
                             + 0x2ad);
        local_50 = (App *)CONCAT44(local_50._4_4_,(float)iVar17);
        Tile::drawline(dd,local_44,fVar21,(float)iVar17,fVar21,0xffffff);
        Tile::drawline(dd,local_50._0_4_,
                       (float)(int)(((byte)this->fifbit[(long)renderLoop::i + -1] >> 2 & 1) * -0x1e
                                   + 0x2ad),local_50._0_4_,
                       (float)(int)(((byte)this->fifbit[renderLoop::i] >> 2 & 1) * -0x1e + 0x2ad),
                       0xffffff);
        fVar21 = (float)(int)(((byte)this->fifbit[(long)renderLoop::i + -1] >> 3 & 1) * -0x1e +
                             0x2fd);
        Tile::drawline(dd,local_44,fVar21,local_50._0_4_,fVar21,0xffffff);
        Tile::drawline(dd,local_50._0_4_,
                       (float)(int)(((byte)this->fifbit[(long)renderLoop::i + -1] >> 3 & 1) * -0x1e
                                   + 0x2fd),local_50._0_4_,
                       (float)(int)(((byte)this->fifbit[renderLoop::i] >> 3 & 1) * -0x1e + 0x2fd),
                       0xffffff);
        fVar21 = (float)(int)(((byte)this->fifbit[(long)renderLoop::i + -1] >> 4 & 1) * -0x1e +
                             0x325);
        Tile::drawline(dd,local_44,fVar21,local_50._0_4_,fVar21,0xffffff);
        Tile::drawline(dd,local_50._0_4_,
                       (float)(int)(((byte)this->fifbit[(long)renderLoop::i + -1] >> 4 & 1) * -0x1e
                                   + 0x325),local_50._0_4_,
                       (float)(int)(((byte)this->fifbit[renderLoop::i] >> 4 & 1) * -0x1e + 0x325),
                       0xffffff);
      }
      if (dd->x <= iVar17) {
        uVar18 = this->fifn;
        break;
      }
    }
    renderLoop::i = renderLoop::i + 1;
  }
  for (uVar16 = 0; uVar18 != uVar16; uVar16 = uVar16 + 1) {
    if ((long)mousx * this->zoom + this->xoff <= this->fifclk[uVar16]) {
      renderLoop::i = (int)uVar16;
      uVar3 = 0xff00;
      if ((this->fifbit[uVar16] & 0x10U) == 0) {
        uVar3 = 0xff0000;
      }
      Tile::drawcirc(dd,(this->BMPXRES >> 1) + (this->fifcurx[uVar16] >> 6),
                     (this->BMPYRES >> 1) + (this->fifcury[uVar16] >> 6),5,uVar3);
      uVar16 = (ulong)renderLoop::i;
      pcVar5 = this->fifbit;
      iVar19 = renderLoop::i;
      uVar12 = renderLoop::i;
      iVar17 = 1;
      if (renderLoop::i < 1) {
        iVar17 = renderLoop::i;
      }
      goto LAB_00104702;
    }
  }
  renderLoop::i = (int)uVar18;
  goto LAB_0010496b;
  while (iVar19 = iVar14 + -1, iVar15 = iVar14, (pcVar5[uVar12] & 1U) == 0) {
LAB_00104702:
    iVar14 = iVar19;
    uVar12 = uVar12 - 1;
    iVar15 = iVar17;
    if (iVar14 < 2) break;
  }
  uVar8 = this->fifn - 1;
  uVar18 = uVar16;
  if (uVar16 < uVar8) {
    uVar18 = uVar8;
  }
  do {
    uVar11 = uVar16;
    uVar20 = uVar18;
    if (uVar8 <= uVar11) break;
    uVar16 = uVar11 + 1;
    uVar20 = uVar11;
  } while ((pcVar5[uVar11] & 1U) == 0);
  iVar19 = renderLoop::i;
  uVar13 = renderLoop::i;
  if (0 < iVar15) {
    Tile::drawline(dd,(float)((this->fifclk[uVar12] - this->xoff) / this->zoom),628.0,
                   (float)((this->fifclk[uVar20] - this->xoff) / this->zoom),628.0,0x808080);
    sVar10 = this->fifclk[uVar20] - this->fifclk[uVar12];
    Tile::print6x8(dd,mousx + 2,0x26c,0xffffff,0,"%d clk",sVar10);
    Tile::print6x8(dd,mousx + 2,0x276,0xffffff,0,"(%.1f Hz)",
                   (double)this->CLKFRQ / (double)(this->fifclk[uVar20] - this->fifclk[uVar12]));
    pcVar5 = this->fifbit;
    iVar19 = renderLoop::i;
    uVar13 = renderLoop::i;
    iVar17 = 1;
    if (renderLoop::i < 1) {
      iVar17 = renderLoop::i;
    }
  }
  do {
    uVar13 = uVar13 - 1;
    iVar15 = iVar17;
    if (iVar19 < 2) break;
    iVar15 = iVar19;
    iVar19 = iVar19 + -1;
  } while ((pcVar5[uVar13] & 2U) == 0);
  uVar8 = this->fifn - 1;
  uVar16 = (ulong)renderLoop::i;
  uVar18 = uVar16;
  if (uVar16 < uVar8) {
    uVar18 = uVar8;
  }
  do {
    uVar11 = uVar16;
    uVar20 = uVar18;
    if (uVar8 <= uVar11) break;
    uVar16 = uVar11 + 1;
    uVar20 = uVar11;
  } while ((pcVar5[uVar11] & 2U) == 0);
  if (0 < iVar15) {
    Tile::drawline(dd,(float)((this->fifclk[uVar13] - this->xoff) / this->zoom),708.0,
                   (float)((this->fifclk[uVar20] - this->xoff) / this->zoom),708.0,0x808080);
    sVar10 = this->fifclk[uVar20] - this->fifclk[uVar13];
    Tile::print6x8(dd,mousx + 2,700,0xffffff,0,"%d clk",sVar10);
    Tile::print6x8(dd,mousx + 2,0x2c6,0xffffff,0,"(%.1f Hz)",
                   (double)this->CLKFRQ / (double)(this->fifclk[uVar20] - this->fifclk[uVar13]));
  }
LAB_0010496b:
  Tile::drawline(dd,(float)mousx,615.0,(float)mousx,815.0,0x406080);
  Tile::print6x8(dd,mousx,0x25f,0xffffff,0,"%.6f sec",
                 (double)((long)mousx * this->zoom + this->xoff) / (double)this->CLKFRQ,sVar10);
  Tile::print6x8(dd,5,0x274,0xffffff,0,"X Pulse:");
  Tile::print6x8(dd,5,0x29c,0xffffff,0,"X Dir:");
  Tile::print6x8(dd,5,0x2c4,0xffffff,0,"Y Pulse:");
  Tile::print6x8(dd,5,0x2ec,0xffffff,0,"Y Dir:");
  Tile::print6x8(dd,5,0x314,0xffffff,0,"Pen Down:");
  return;
}

Assistant:

void Simulator::renderLoop(Tile& dd) {
    App& app = *this->app;

    /* Copy drawing to texture */
    for(int y = min(dd.gety(),BMPYRES)-1; y >= 0; y--) {
        uint32_t* wptr = reinterpret_cast<uint32_t*>(dd.getp()*y + dd.getf());
        for(int x = min(dd.getx(),BMPXRES)-1; x >= 0; x--) {
            wptr[x] = drawing.getpix(x, y);
        }
    }

    /* Fill in the blank */
    dd.drawrectfill(BMPXRES, 0, dd.getx(), BMPYRES, BACKGROUND_COLOR);
    dd.drawrectfill(0, BMPYRES, dd.getx(), dd.gety(), BACKGROUND_COLOR);

    /* Draw pen location */
    if (!odown) {
        dd.drawcirc((acur[0]>>6)+(BMPXRES>>1), (acur[1]>>6)+(BMPYRES>>1), 20, UP_LOC_COLOR);
    } else {
        dd.drawcirc((acur[0]>>6)+(BMPXRES>>1), (acur[1]>>6)+(BMPYRES>>1), 20, DOWN_LOC_COLOR);
    }

    /* Show timing info */
    dd.print6x8(0,0,0xffffff,BACKGROUND_COLOR,"%.2f sec, fifn=%d",(double)pclk/CLKFRQ,fifn);

#if ENABLE_SCOPE
    /* Scope, timing plot */
    static int64_t rzoom;
    static double tim = 0.0, otim, dtim;
    static int i, dpx, dpy;

    // Get app status
    const char* keystatus = app.getKeyStatus();
    int mousx, mousy, dmousx, dmousy, bstatus;
    app.getMouseStatus(mousx, mousy, dmousx, dmousy, bstatus);

    // Pan left/right with arrow keys
    otim = tim;
    tim = static_cast<double>(app.getTime())*.001;
    dtim = tim-otim;
    xoff += (keystatus[0xcd]-keystatus[0xcb])*zoom*512*dtim;

    // Zoom and pan with mouse
    if (bstatus & 1<<1) { // right mouse botton down
        // pan
        xoff += dmousx * zoom;
        // zoom
        i = min(max(zoom+(zoom*dmousy)/100,100),10000000);
        xoff += (zoom-i)*mousx;
        zoom = i;
    }

    // Error message
    if (fault) {
        int x = (faultclk-xoff)/zoom;
        if ((fault>>1) == 1) dd.print6x8(x,YOFF-10,0xff8080,FONT_B_COLOR,"fault: %c div by 0",(fault&1)+'x');
        if ((fault>>1) == 2) dd.print6x8(x,YOFF-10,0xff8080,FONT_B_COLOR,"fault: %c dir change at hi veloc",(fault&1)+'x');
        if ((fault>>1) == 3) dd.print6x8(x,YOFF-10,0xff8080,FONT_B_COLOR,"fault: %c veloc too high",(fault&1)+'x');
        if ((fault>>1) == 4) dd.print6x8(x,YOFF-10,0xff8080,FONT_B_COLOR,"fault: %c accel too high",(fault&1)+'x');
        dd.drawline(x,YOFF,x,YOFF+200,0xff8080);
    }

    // Scope background
    int ox = (0-xoff)/zoom;
    int x  = (fifclk[fifn-1]-xoff)/zoom;
    for(i=0;i<5;i++) {
         dd.drawrectfill(ox,YOFF+i*40,x,YOFF+30+i*40,0x404040);
    }
    ox = 0; dpx = -1; dpy = -1;
    rzoom = (((1<<30)/zoom)<<2);

    // Scope data
     for(i=0;i<fifn;i++)
     {
         x = (((fifclk[i]-xoff)*rzoom)>>32); if (x < 0) continue;
         if ((x > dpx) && (fifbit[i]&1)) { dpx = x; dd.drawline(x,YOFF   ,x,YOFF+ 30,0xffffff); }
         if ((x > dpy) && (fifbit[i]&2)) { dpy = x; dd.drawline(x,YOFF+80,x,YOFF+110,0xffffff); }
         if (i > 0)
         {
             dd.drawline(ox,((fifbit[i-1]>>2)&1)*-30+YOFF+ 70,x,((fifbit[i-1]>>2)&1)*-30+YOFF+70,0xffffff);
             dd.drawline(x,((fifbit[i-1]>>2)&1)*-30+YOFF+ 70,x,((fifbit[i  ]>>2)&1)*-30+YOFF+70,0xffffff);

             dd.drawline(ox,((fifbit[i-1]>>3)&1)*-30+YOFF+150,x,((fifbit[i-1]>>3)&1)*-30+YOFF+150,0xffffff);
             dd.drawline( x,((fifbit[i-1]>>3)&1)*-30+YOFF+150,x,((fifbit[i  ]>>3)&1)*-30+YOFF+150,0xffffff);

             dd.drawline(ox,((fifbit[i-1]>>4)&1)*-30+YOFF+190,x,((fifbit[i-1]>>4)&1)*-30+YOFF+190,0xffffff);
             dd.drawline( x,((fifbit[i-1]>>4)&1)*-30+YOFF+190,x,((fifbit[i  ]>>4)&1)*-30+YOFF+190,0xffffff);
         }
         ox = x; if (x >= dd.getx()) break;
     }

    // Scope annotation
     for(i=0;i<fifn;i++)
     {
         if (fifclk[i] >= mousx*zoom + xoff)
         {
             int i0, i1;
             dd.drawcirc((fifcurx[i]>>6)+(BMPXRES>>1),(fifcury[i]>>6)+(BMPYRES>>1),5,
                (fifbit[i] & (1<<4))? DOWN_LOC_COLOR : UP_LOC_COLOR);

             for(i0=i-1;i0> 0    ;i0--) if (fifbit[i0]&1) break;
             for(i1=i  ;i1<fifn-1;i1++) if (fifbit[i1]&1) break;
             if (i0 >= 0)
             {
                 dd.drawline((fifclk[i0]-xoff)/zoom,YOFF+13,(fifclk[i1]-xoff)/zoom,YOFF+13,0x808080);
                 dd.print6x8(mousx+2,YOFF+ 5,FONT_F_COLOR,FONT_B_COLOR,"%d clk",fifclk[i1]-fifclk[i0]);
                 dd.print6x8(mousx+2,YOFF+15,FONT_F_COLOR,FONT_B_COLOR,"(%.1f Hz)",CLKFRQ/(double)(fifclk[i1]-fifclk[i0]));
             }

             for(i0=i-1;i0> 0    ;i0--) if (fifbit[i0]&2) break;
             for(i1=i  ;i1<fifn-1;i1++) if (fifbit[i1]&2) break;
             if (i0 >= 0)
             {
                 dd.drawline((fifclk[i0]-xoff)/zoom,YOFF+93,(fifclk[i1]-xoff)/zoom,YOFF+93,0x808080);
                 dd.print6x8(mousx+2,YOFF+85,FONT_F_COLOR,FONT_B_COLOR,"%d clk",fifclk[i1]-fifclk[i0]);
                 dd.print6x8(mousx+2,YOFF+95,FONT_F_COLOR,FONT_B_COLOR,"(%.1f Hz)",CLKFRQ/(double)(fifclk[i1]-fifclk[i0]));
             }

             break;
         }
    }

    // Scope time cursor
    dd.drawline(mousx,YOFF,mousx,YOFF+200,0x406080);
    dd.print6x8(mousx,YOFF - 8,FONT_F_COLOR,FONT_B_COLOR,"%.6f sec",(double)(mousx*zoom + xoff)/CLKFRQ);

    // Scope captions
    dd.print6x8(5, YOFF+ 13, FONT_F_COLOR, FONT_B_COLOR, "X Pulse:");
    dd.print6x8(5, YOFF+ 53, FONT_F_COLOR, FONT_B_COLOR, "X Dir:");
    dd.print6x8(5, YOFF+ 93, FONT_F_COLOR, FONT_B_COLOR, "Y Pulse:");
    dd.print6x8(5, YOFF+133, FONT_F_COLOR, FONT_B_COLOR, "Y Dir:");
    dd.print6x8(5, YOFF+173, FONT_F_COLOR, FONT_B_COLOR, "Pen Down:");
#endif // ENABLE_SCOPE
}